

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v11::detail::do_format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  undefined8 in_RAX;
  uint in_ECX;
  undefined4 in_register_00000014;
  ulong uVar1;
  undefined8 unaff_RBX;
  ulong uVar2;
  undefined1 auVar3 [16];
  
  uVar1 = CONCAT44(in_register_00000014,size);
  auVar3._8_8_ = unaff_RBX;
  auVar3._0_8_ = in_RAX;
  count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar3);
  while( true ) {
    uVar2 = (ulong)(in_ECX - 2);
    if (uVar1 < (out < (char *)0x64)) break;
    auVar3 = __udivti3(out,uVar1,100,0);
    uVar1 = auVar3._8_8_;
    *(undefined2 *)(this + uVar2) =
         *(undefined2 *)(digits2(unsigned_long)::data + (long)(out + (long)auVar3._0_8_ * -100) * 2)
    ;
    out = auVar3._0_8_;
    in_ECX = in_ECX - 2;
  }
  if (uVar1 < (out < (char *)0xa)) {
    uVar2 = (ulong)(in_ECX - 1);
    this[uVar2] = (detail)((byte)out | 0x30);
  }
  else {
    *(undefined2 *)(this + uVar2) = *(undefined2 *)(digits2(unsigned_long)::data + (long)out * 2);
  }
  return (char *)(this + uVar2);
}

Assistant:

FMT_CONSTEXPR20 auto do_format_decimal(Char* out, UInt value, int size)
    -> Char* {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  unsigned n = to_unsigned(size);
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value % 100));
    value /= 100;
  }
  if (value >= 10) {
    n -= 2;
    write2digits(out + n, static_cast<unsigned>(value));
  } else {
    out[--n] = static_cast<Char>('0' + value);
  }
  return out + n;
}